

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_dispatcher_template.hpp
# Opt level: O2

void __thiscall
so_5::disp::reuse::
proxy_dispatcher_template_t<so_5::disp::prio_dedicated_threads::one_per_prio::impl::actual_disp_iface_t,so_5::disp::prio_dedicated_threads::one_per_prio::disp_params_t>
::
make_actual_dispatcher<so_5::disp::prio_dedicated_threads::one_per_prio::impl::dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>>,so_5::disp::prio_dedicated_threads::one_per_prio::impl::dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>>,so_5::environment_t,so_5::disp::prio_dedicated_threads::one_per_prio::disp_params_t&>
          (proxy_dispatcher_template_t<so_5::disp::prio_dedicated_threads::one_per_prio::impl::actual_disp_iface_t,so_5::disp::prio_dedicated_threads::one_per_prio::disp_params_t>
           *this,environment_t *env,disp_params_t *args)

{
  long *plVar1;
  long *plVar2;
  long *local_20;
  
  stats::activity_tracking_stuff::
  create_appropriate_disp<so_5::disp::prio_dedicated_threads::one_per_prio::impl::actual_disp_iface_t,so_5::disp::prio_dedicated_threads::one_per_prio::impl::dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>>,so_5::disp::prio_dedicated_threads::one_per_prio::impl::dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>>,so_5::environment_t,so_5::disp::prio_dedicated_threads::one_per_prio::disp_params_t,so_5::disp::prio_dedicated_threads::one_per_prio::disp_params_t&>
            ((activity_tracking_stuff *)&local_20,env,(disp_params_t *)(this + 0x10),args);
  (**(code **)(*local_20 + 0x28))(local_20,this + 0x38);
  (**(code **)(*local_20 + 0x10))(local_20,env);
  plVar2 = local_20;
  local_20 = (long *)0x0;
  plVar1 = *(long **)(this + 8);
  *(long **)(this + 8) = plVar2;
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 8))();
    if (local_20 != (long *)0x0) {
      (**(code **)(*local_20 + 8))();
    }
  }
  return;
}

Assistant:

void
		make_actual_dispatcher(
			ENV & env,
			ARGS && ...args )
			{
				using so_5::stats::activity_tracking_stuff::create_appropriate_disp;
				auto disp = create_appropriate_disp<
						DISP_IFACE_TYPE,
						DISP_NO_TRACKING,
						DISP_WITH_TRACKING >(
					env,
					m_disp_params,
					std::forward<ARGS>(args)... );

				disp->set_data_sources_name_base( m_data_source_base_name );
				disp->start( env );

				m_disp = std::move( disp );
			}